

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O0

bool __thiscall ADSBBase::ProcessFetchedData(ADSBBase *this)

{
  bool bVar1;
  logLevelTy lVar2;
  uint uVar3;
  int iVar4;
  FDKeyTy *this_00;
  char *pcVar5;
  ulong uVar6;
  LTChannel *in_RDI;
  system_error *e;
  FDKeyTy fdKey;
  FDKeyType keyType;
  string hexKey;
  JSON_Object *pJAc;
  size_t i;
  JSON_Array *pJAcList;
  string acFilter;
  double tBufPeriod;
  double adsbxTime;
  positionTy viewPos;
  JSON_Object *pObj;
  JSONRootPtr pRoot;
  string *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  JSON_Object *in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd80;
  byte in_stack_fffffffffffffd81;
  undefined1 in_stack_fffffffffffffd82;
  byte in_stack_fffffffffffffd83;
  undefined4 in_stack_fffffffffffffd84;
  double in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  allocator<char> *__a;
  DataRefs *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  logLevelTy in_stack_fffffffffffffdb4;
  size_t in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 uVar7;
  FDKeyTy *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  char *local_1e0;
  char *local_1d8;
  string local_1b8 [24];
  string local_198 [4];
  undefined4 local_148;
  allocator<char> local_141;
  string local_140 [32];
  JSON_Object *local_120;
  ulong local_118;
  FDKeyTy *local_110;
  string local_108 [32];
  double local_e8;
  double local_e0;
  JSON_Object *local_90;
  int local_84;
  byte local_69;
  string local_68 [55];
  byte local_31;
  string local_30 [47];
  byte local_1;
  
  if ((in_RDI[3].urlLink._M_string_length == 0x191) || (in_RDI[3].urlLink._M_string_length == 0x193)
     ) {
    lVar2 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar2 < 4) {
      local_31 = 0;
      if (in_RDI[1].urlName._M_string_length == 0) {
        local_1d8 = "";
      }
      else {
        FetchMsg_abi_cxx11_((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
        local_31 = 1;
        local_1d8 = (char *)std::__cxx11::string::c_str();
      }
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x3a,"ProcessFetchedData",logERR,"ADS-B Exchange: API Key test FAILED: %s",local_1d8);
      if ((local_31 & 1) != 0) {
        std::__cxx11::string::~string(local_30);
      }
    }
    local_69 = 0;
    if (in_RDI[1].urlName._M_string_length == 0) {
      local_1e0 = "";
    }
    else {
      FetchMsg_abi_cxx11_((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      local_69 = 1;
      local_1e0 = (char *)std::__cxx11::string::c_str();
    }
    CreateMsgWindow(12.0,logERR,"ADS-B Exchange: API Key test FAILED: %s",local_1e0);
    if ((local_69 & 1) != 0) {
      std::__cxx11::string::~string(local_68);
    }
    (*in_RDI->_vptr_LTChannel[7])(in_RDI,0,1);
    local_1 = 0;
  }
  else if (in_RDI[1].urlName._M_string_length == 0) {
    (*in_RDI->_vptr_LTChannel[8])();
    local_1 = 0;
  }
  else {
    JSONRootPtr::JSONRootPtr
              ((JSONRootPtr *)
               CONCAT44(in_stack_fffffffffffffd84,
                        CONCAT13(in_stack_fffffffffffffd83,
                                 CONCAT12(in_stack_fffffffffffffd82,
                                          CONCAT11(in_stack_fffffffffffffd81,
                                                   in_stack_fffffffffffffd80)))),
               (char *)in_stack_fffffffffffffd78);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<json_value_t,_void_(*)(json_value_t_*)> *)0x17ec87);
    if (bVar1) {
      std::unique_ptr<json_value_t,_void_(*)(json_value_t_*)>::get
                ((unique_ptr<json_value_t,_void_(*)(json_value_t_*)> *)
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      local_90 = json_object((JSON_Value *)0x17ed37);
      if (local_90 == (JSON_Object *)0x0) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                 ,0x4c,"ProcessFetchedData",logERR,"JSON: Getting main object failed");
        }
        (*in_RDI->_vptr_LTChannel[8])();
        local_1 = 0;
        local_84 = 1;
      }
      else {
        uVar3 = (*in_RDI->_vptr_LTChannel[0x16])(in_RDI,local_90);
        if ((uVar3 & 1) == 0) {
          local_1 = 0;
          local_84 = 1;
        }
        else {
          DataRefs::GetViewPos();
          local_e0 = jog_n_nan(in_stack_fffffffffffffd78,
                               (char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)
                              );
          uVar3 = std::isnan(local_e0);
          local_148 = in_stack_fffffffffffffd84;
          if ((uVar3 & 1) != 0) {
            local_e0 = jog_n((JSON_Object *)
                             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                             (char *)in_stack_fffffffffffffd68);
            local_148 = in_stack_fffffffffffffd84;
          }
          if (70000000000.0 < local_e0) {
            local_e0 = local_e0 / 1000.0;
          }
          if (1546344000.0 < local_e0) {
            DataRefs::ChTsOffsetAdd
                      ((DataRefs *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd88);
          }
          iVar4 = DataRefs::GetFdBufPeriod(&dataRefs);
          local_e8 = (double)iVar4;
          DataRefs::GetDebugAcFilter_abi_cxx11_(in_stack_fffffffffffffda8);
          this_00 = (FDKeyTy *)
                    json_object_get_array
                              ((JSON_Object *)
                               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                               (char *)in_stack_fffffffffffffd68);
          local_110 = this_00;
          if (this_00 == (FDKeyTy *)0x0) {
            in_stack_fffffffffffffdd8 =
                 (FDKeyTy *)
                 json_object_get_array
                           ((JSON_Object *)
                            CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                            (char *)in_stack_fffffffffffffd68);
            local_110 = in_stack_fffffffffffffdd8;
          }
          local_118 = 0;
          while( true ) {
            uVar6 = local_118;
            uVar7 = false;
            if (local_110 != (FDKeyTy *)0x0) {
              in_stack_fffffffffffffdc8 = json_array_get_count((JSON_Array *)local_110);
              uVar7 = uVar6 < in_stack_fffffffffffffdc8;
            }
            if ((bool)uVar7 == false) break;
            local_120 = json_array_get_object
                                  ((JSON_Array *)
                                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                   (size_t)in_stack_fffffffffffffd68);
            if (local_120 == (JSON_Object *)0x0) {
              in_stack_fffffffffffffdb4 = DataRefs::GetLogLevel(&dataRefs);
              if ((int)in_stack_fffffffffffffdb4 < 4) {
                in_stack_fffffffffffffd68 = (string *)0x384ce0;
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                       ,0x72,"ProcessFetchedData",logERR,
                       "JSON: Could not get %lu. aircraft in \'%s\'",local_118 + 1);
              }
              uVar3 = (*in_RDI->_vptr_LTChannel[8])();
              in_stack_fffffffffffffdb0 = CONCAT13((char)uVar3,(int3)in_stack_fffffffffffffdb0);
              if ((uVar3 & 1) == 0) {
                local_1 = 0;
                local_84 = 1;
                goto LAB_0017f665;
              }
            }
            else {
              pcVar5 = jog_s((JSON_Object *)
                             CONCAT44(local_148,
                                      CONCAT13(in_stack_fffffffffffffd83,
                                               CONCAT12(in_stack_fffffffffffffd82,
                                                        CONCAT11(in_stack_fffffffffffffd81,
                                                                 in_stack_fffffffffffffd80)))),
                             (char *)in_stack_fffffffffffffd78);
              __a = &local_141;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),pcVar5,__a);
              std::allocator<char>::~allocator(&local_141);
              uVar6 = std::__cxx11::string::empty();
              if ((uVar6 & 1) == 0) {
                local_148 = 4;
                pcVar5 = (char *)std::__cxx11::string::front();
                if (*pcVar5 == '~') {
                  std::__cxx11::string::erase((ulong)local_140,0);
                  local_148 = 6;
                }
                std::__cxx11::string::string(local_198,local_140);
                LTFlightData::FDKeyTy::FDKeyTy
                          (this_00,(FDKeyType)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                           (string *)CONCAT17(uVar7,in_stack_fffffffffffffdd0),
                           (int)(in_stack_fffffffffffffdc8 >> 0x20));
                std::__cxx11::string::~string(local_198);
                uVar3 = std::__cxx11::string::empty();
                in_stack_fffffffffffffd81 = 0;
                in_stack_fffffffffffffd83 = in_stack_fffffffffffffd81;
                if ((uVar3 & 1) == 0) {
                  std::__cxx11::string::string(local_1b8,local_108);
                  in_stack_fffffffffffffd81 =
                       LTFlightData::FDKeyTy::operator!=
                                 ((FDKeyTy *)
                                  CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                  in_stack_fffffffffffffd68);
                  in_stack_fffffffffffffd82 = in_stack_fffffffffffffd81;
                  in_stack_fffffffffffffd83 = in_stack_fffffffffffffd81;
                  std::__cxx11::string::~string(local_1b8);
                }
                if ((in_stack_fffffffffffffd81 & 1) == 0) {
                  ProcessV2((ADSBBase *)viewPos._lat,(JSON_Object *)adsbxTime,(FDKeyTy *)tBufPeriod,
                            (double)acFilter.field_2._8_8_,
                            (double)acFilter.field_2._M_allocated_capacity,
                            (positionTy *)acFilter._M_string_length);
                  local_84 = 0;
                }
                else {
                  local_84 = 4;
                }
                LTFlightData::FDKeyTy::~FDKeyTy((FDKeyTy *)0x17f5f0);
              }
              else {
                pcVar5 = jog_s((JSON_Object *)
                               CONCAT44(local_148,
                                        CONCAT13(in_stack_fffffffffffffd83,
                                                 CONCAT12(in_stack_fffffffffffffd82,
                                                          CONCAT11(in_stack_fffffffffffffd81,
                                                                   in_stack_fffffffffffffd80)))),
                               (char *)in_stack_fffffffffffffd78);
                std::__cxx11::string::operator=(local_140,pcVar5);
                uVar6 = std::__cxx11::string::empty();
                if ((uVar6 & 1) == 0) {
                  lVar2 = DataRefs::GetLogLevel(&dataRefs);
                  if ((int)lVar2 < 3) {
                    pcVar5 = LTChannel::ChName(in_RDI);
                    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                           ,0x81,"ProcessFetchedData",logWARN,
                           "%s: Received data looks like ADSBEx v1, which is no longer supported!",
                           pcVar5);
                  }
                  (*in_RDI->_vptr_LTChannel[8])();
                  local_1 = 0;
                  local_84 = 1;
                }
                else {
                  local_84 = 4;
                }
              }
              std::__cxx11::string::~string(local_140);
              in_stack_fffffffffffffd74 = local_84;
              if ((local_84 != 0) && (local_84 != 4)) goto LAB_0017f665;
            }
            local_118 = local_118 + 1;
          }
          local_1 = 1;
          local_84 = 1;
LAB_0017f665:
          std::__cxx11::string::~string(local_108);
        }
      }
    }
    else {
      lVar2 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar2 < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
               ,0x48,"ProcessFetchedData",logERR,"Parsing flight data as JSON failed");
      }
      (*in_RDI->_vptr_LTChannel[8])();
      local_1 = 0;
      local_84 = 1;
    }
    JSONRootPtr::~JSONRootPtr((JSONRootPtr *)0x17f690);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ADSBBase::ProcessFetchedData ()
{
    // received an UNAUTHOIZRED response? Then the key is invalid!
    if (httpResponse == HTTP_UNAUTHORIZED || httpResponse == HTTP_FORBIDDEN) {
        SHOW_MSG(logERR, ERR_ADSBEX_KEY_FAILED,
                 netDataPos ? FetchMsg(netData).c_str() : "");
        SetValid(false);
        return false;
    }

    // data is expected to be in netData string
    // short-cut if there is nothing
    if ( !netDataPos ) {
        IncErrCnt();
        return false;
    }
    
    // now try to interpret it as JSON
    JSONRootPtr pRoot (netData);
    if (!pRoot) { LOG_MSG(logERR,ERR_JSON_PARSE); IncErrCnt(); return false; }
    
    // first get the structre's main object
    JSON_Object* pObj = json_object(pRoot.get());
    if (!pObj) { LOG_MSG(logERR,ERR_JSON_MAIN_OBJECT); IncErrCnt(); return false; }
    
    // Test for any channel-specific errors
    if (!ProcessErrors(pObj)) return false;
    
    // We need to calculate distance to current camera later on
    const positionTy viewPos = dataRefs.GetViewPos();
    
    // for determining an offset as compared to network time we need to know network time
    // Also used later to calcualte the position's timestamp
    double adsbxTime = jog_n_nan(pObj, ADSBEX_NOW);
    if (std::isnan(adsbxTime))
        adsbxTime = jog_n(pObj, ADSBEX_TIME);
    // Convert a timestamp in milliseconds to a timestamp in seconds
    if (adsbxTime > 70000000000.0)
        adsbxTime /= 1000.0;
    
    // if reasonable add this to our time offset calculation
    if (adsbxTime > JAN_FIRST_2019)
        dataRefs.ChTsOffsetAdd(adsbxTime);
    
    // Cut-off time: We ignore tracking data, which is older than our buffering time
    const double tBufPeriod = (double) dataRefs.GetFdBufPeriod();
    
    // any a/c filter defined for debugging purposes?
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );
    
    // let's cycle the aircraft
    // fetch the aircraft array, adsb.fi defines a different aircraft key unfortunately
    JSON_Array* pJAcList = json_object_get_array(pObj, ADSBEX_AIRCRAFT_ARR);
    if (!pJAcList)
        pJAcList = json_object_get_array(pObj, ADSBFI_AIRCRAFT_ARR);
    // iterate all aircraft in the received flight data (can be 0 or even pJAcList == NULL!)
    for ( size_t i=0; pJAcList && (i < json_array_get_count(pJAcList)); i++ )
    {
        // get the aircraft
        JSON_Object* pJAc = json_array_get_object(pJAcList,i);
        if (!pJAc) {
            LOG_MSG(logERR,ERR_JSON_AC,i+1,ADSBEX_AIRCRAFT_ARR);
            if (IncErrCnt())
                continue;
            else
                return false;
        }
        
        // try version 2 first
        std::string hexKey = jog_s(pJAc, ADSBEX_V2_TRANSP_ICAO);
        if (hexKey.empty()) {
            // not found, try version 1
            hexKey = jog_s(pJAc, ADSBEX_V1_TRANSP_ICAO);
            if (!hexKey.empty()) {
                // Hm...this could be v1 data...since v4.2 we don't process that any longer
                LOG_MSG(logWARN, "%s: Received data looks like ADSBEx v1, which is no longer supported!",
                        ChName());
                IncErrCnt();
                return false;
            }
            // Either way, this can't be processed
            continue;
        }
        
        // the key: transponder Icao code or some other code
        LTFlightData::FDKeyType keyType = LTFlightData::KEY_ICAO;
        if (hexKey.front() == '~') {        // key is a non-icao code?
            hexKey.erase(0, 1);             // remove the ~
            keyType = LTFlightData::KEY_ADSBEX;
        }
        LTFlightData::FDKeyTy fdKey (keyType, hexKey);
        
        // not matching a/c filter? -> skip it
        if (!acFilter.empty() && (fdKey != acFilter))
            continue;

        // Process the details
        try {
            ProcessV2(pJAc, fdKey, tBufPeriod, adsbxTime, viewPos);
        } catch(const std::system_error& e) {
            LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
        } catch(...) {
            LOG_MSG(logERR, "Exception while processing data for '%s'", hexKey.c_str());
        }
    }
    
    // success
    return true;
}